

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::JsRTConstructCallAction_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  uint32 uVar1;
  JsRTConstructCallAction *pJVar2;
  TTDVar pvVar3;
  void **ppvVar4;
  Var *ppvVar5;
  uint32 i;
  ulong uVar6;
  
  pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTConstructCallAction,(TTD::NSLogEvents::EventKind)66>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar3 = NSSnapValues::ParseTTDVar(false,reader);
  pJVar2->Result = pvVar3;
  uVar1 = FileReader::ReadLengthValue(reader,true);
  pJVar2->ArgCount = uVar1;
  ppvVar4 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)uVar1);
  pJVar2->ArgArray = ppvVar4;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  for (uVar6 = 0; uVar6 < pJVar2->ArgCount; uVar6 = uVar6 + 1) {
    pvVar3 = NSSnapValues::ParseTTDVar(uVar6 != 0,reader);
    pJVar2->ArgArray[uVar6] = pvVar3;
  }
  (*reader->_vptr_FileReader[5])(reader);
  if (pJVar2->ArgCount < 2) {
    ppvVar5 = (Var *)0x0;
  }
  else {
    ppvVar5 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)(pJVar2->ArgCount - 1));
  }
  pJVar2->ExecArgs = ppvVar5;
  return;
}

Assistant:

void JsRTConstructCallAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTConstructCallAction* ccAction = GetInlineEventDataAs<JsRTConstructCallAction, EventKind::ConstructCallActionTag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            ccAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            ccAction->ArgCount = reader->ReadLengthValue(true);
            ccAction->ArgArray = alloc.SlabAllocateArray<TTDVar>(ccAction->ArgCount);

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < ccAction->ArgCount; ++i)
            {
                ccAction->ArgArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
            }
            reader->ReadSequenceEnd();

            ccAction->ExecArgs = (ccAction->ArgCount > 1) ? alloc.SlabAllocateArray<Js::Var>(ccAction->ArgCount - 1) : nullptr; //ArgCount includes slot for function which we don't use in exec
        }